

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O1

ComplexPair * __thiscall
Iir::BandStopTransform::transform
          (ComplexPair *__return_storage_ptr__,BandStopTransform *this,complex_t c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  double dVar3;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined1 local_38 [24];
  
  if (INFINITY <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
    local_68 = -1.0;
    if ((in_XMM1_Qa == 0.0) && (dStack_60 = 0.0, !NAN(in_XMM1_Qa))) goto LAB_00103894;
  }
  local_68 = (double)__divdc3(SUB84((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) + 1.0,0),in_XMM1_Qa,
                              1.0 - (double)CONCAT44(in_XMM0_Db,in_XMM0_Da),-in_XMM1_Qa,
                              __return_storage_ptr__,this,c._M_value._0_8_,c._M_value._8_8_);
  dStack_60 = in_XMM1_Qa;
LAB_00103894:
  dVar5 = (this->b2 + this->a2 + -1.0) * 4.0;
  local_38._8_8_ = dVar5 * dStack_60 + 0.0;
  local_38._0_8_ = ((this->b2 - this->a2) + 1.0) * 8.0 + dVar5 * local_68 + 0.0;
  std::complex<double>::operator*=((complex<double> *)local_38,(complex<double> *)&local_68);
  local_38._0_8_ = (this->a2 + this->b2 + -1.0) * 4.0 + (double)local_38._0_8_;
  dVar3 = csqrt((double)local_38._0_8_);
  dVar5 = this->a;
  local_48 = (dVar3 * -0.5 + dVar5) - dVar5 * local_68;
  dVar6 = (double)local_38._8_8_ * -0.5 - dVar5 * dStack_60;
  dVar3 = (dVar3 * 0.5 + dVar5) - dVar5 * local_68;
  dVar5 = (double)local_38._8_8_ * 0.5 - dVar5 * dStack_60;
  local_38._8_4_ = SUB84(dVar5,0);
  local_38._0_8_ = dVar3;
  local_38._12_4_ = (int)((ulong)dVar5 >> 0x20);
  dVar4 = this->b + -1.0;
  local_58 = local_68 * dVar4 + this->b + 1.0;
  dStack_50 = dStack_60;
  dVar4 = dVar4 * dStack_60;
  uVar1 = __divdc3(SUB84(dVar3,0),dVar5,local_58);
  uVar2 = __divdc3(local_48._0_4_,dVar6,local_58,dVar4 + 0.0);
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value = uVar1;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).first._M_value + 8) = dVar5;
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).second._M_value = uVar2;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).second._M_value + 8) = dVar6;
  return __return_storage_ptr__;
}

Assistant:

ComplexPair BandStopTransform::transform (complex_t c)
{
	if (c == infinity())
		c = -1;
	else
		c = (1. + c) / (1. - c); // bilinear
	
	complex_t u (0);
	u = addmul (u, 4 * (b2 + a2 - 1), c);
	u += 8 * (b2 - a2 + 1);
	u *= c;
	u += 4 * (a2 + b2 - 1);
	u = std::sqrt (u);
	
	complex_t v = u * -.5;
	v += a;
	v = addmul (v, -a, c);
	
	u *= .5;
	u += a;
	u = addmul (u, -a, c);
	
	complex_t d (b + 1);
	d = addmul (d, b-1, c);
	
	return ComplexPair (u/d, v/d);
}